

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

int parsedate(char *date,time_t *output)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  int i;
  int iVar10;
  int iVar11;
  char **what;
  char **ppcVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int secnum;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  ulong local_78;
  byte *local_70;
  byte *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long *local_40;
  byte *local_38;
  
  local_7c = -1;
  local_80 = -1;
  local_78 = 0xffffffff;
  local_8c = -1;
  iVar11 = -1;
  bVar16 = false;
  local_90 = 0xffffffff;
  iVar5 = 0;
  iVar10 = -1;
  lVar8 = 0xffffffff;
  local_40 = output;
  local_38 = (byte *)date;
  do {
    bVar1 = *date;
    if ((bVar1 == 0) || (5 < iVar5)) {
      if (local_8c == -1) {
        local_7c = 0;
        local_80 = 0;
        local_8c = 0;
      }
      if (local_90 == 0xffffffff) {
        return -1;
      }
      if (iVar10 == -1) {
        return -1;
      }
      if ((int)local_78 < 0x62f) {
        return -1;
      }
      if ((0x3c < local_8c || 0x3b < local_80) ||
          (0x17 < local_7c || (0xb < iVar10 || 0x1f < (int)local_90))) {
        return -1;
      }
      uVar6 = (int)local_78 - (uint)(iVar10 < 2);
      if (iVar11 == -1) {
        iVar11 = 0;
      }
      *local_40 = (((long)local_7c +
                   ((long)(int)local_90 + (long)((int)local_78 + -0x7b2) * 0x16d +
                    (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar10 * 4) +
                   (long)(int)(uVar6 / 400 + ((uVar6 >> 2) - uVar6 / 100) + -0x1dd)) * 0x18) * 0x3c
                  + (long)local_80) * 0x3c + (long)iVar11 + (long)local_8c + -0x15180;
      return 0;
    }
    do {
      iVar4 = Curl_isalnum((uint)bVar1);
      if (iVar4 != 0) break;
      bVar1 = ((byte *)date)[1];
      date = (char *)((byte *)date + 1);
    } while (bVar1 != 0);
    iVar4 = Curl_isalpha((uint)(byte)*date);
    if (iVar4 == 0) {
      iVar4 = Curl_isdigit((uint)(byte)*date);
      if (iVar4 == 0) goto LAB_0013587b;
      local_84 = 0;
      if ((local_8c == -1) &&
         (iVar4 = __isoc99_sscanf(date,"%02d:%02d:%02d%n",&local_7c,&local_80,&local_8c,&local_84),
         iVar4 == 3)) {
LAB_001355dc:
        date = (char *)((byte *)date + local_84);
        bVar15 = true;
      }
      else {
        if ((local_8c == -1) &&
           (iVar4 = __isoc99_sscanf(date,"%02d:%02d%n",&local_7c,&local_80,&local_84), iVar4 == 2))
        {
          local_8c = 0;
          goto LAB_001355dc;
        }
        local_70 = (byte *)CONCAT44(local_70._4_4_,iVar11);
        local_88 = iVar5;
        piVar7 = __errno_location();
        iVar11 = *piVar7;
        *piVar7 = 0;
        lVar13 = strtol(date,(char **)&local_68,10);
        iVar5 = local_88;
        iVar4 = *piVar7;
        if (iVar4 != iVar11) {
          *piVar7 = iVar11;
        }
        bVar15 = false;
        iVar11 = (int)local_70;
        if ((iVar4 == 0) && (0xfffffffeffffffff < lVar13 - 0x80000000U)) {
          uVar6 = curlx_sltosi(lVar13);
          if (iVar11 == -1) {
            iVar11 = -1;
            bVar2 = false;
            if (((local_38 < date) && (bVar2 = false, (long)local_68 - (long)date == 4)) &&
               (bVar2 = false, (int)uVar6 < 0x579)) {
              bVar1 = ((byte *)date)[-1];
              if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_001356a0;
              iVar4 = uVar6 + ((int)uVar6 / 100) * -0x28;
              iVar11 = iVar4 * -0x3c;
              if (bVar1 != 0x2b) {
                iVar11 = iVar4 * 0x3c;
              }
              bVar2 = true;
            }
          }
          else {
LAB_001356a0:
            bVar2 = false;
          }
          local_70 = local_68;
          if ((((long)local_68 - (long)date == 8) && ((int)local_78 == -1)) &&
             ((iVar10 == -1 && (local_90 == 0xffffffff)))) {
            local_78 = (ulong)(uint)((int)uVar6 / 10000);
            iVar10 = ((int)uVar6 % 10000) / 100 + -1;
            local_90 = (int)uVar6 % 100;
            bVar2 = true;
          }
          bVar14 = uVar6 - 1 < 0x1f;
          uVar9 = 0xffffffff;
          if (bVar14) {
            uVar9 = uVar6;
          }
          bVar3 = true;
          bVar15 = bVar2;
          if (bVar14) {
            bVar15 = true;
          }
          if (!(bool)(!bVar16 & ~bVar2 & local_90 == 0xffffffff)) {
            bVar15 = bVar2;
            uVar9 = local_90;
            bVar3 = bVar16;
          }
          local_90 = uVar9;
          bVar16 = bVar3;
          if (((!bVar15) && (bVar3)) && ((int)local_78 == -1)) {
            if ((int)uVar6 < 100) {
              if ((int)uVar6 < 0x47) {
                uVar6 = uVar6 + 2000;
              }
              else {
                uVar6 = uVar6 + 0x76c;
              }
            }
            local_78 = (ulong)uVar6;
            bVar16 = local_90 != 0xffffffff;
            bVar15 = true;
          }
          if (bVar15) {
            date = (char *)local_68;
          }
        }
      }
      if (bVar15) goto LAB_0013587b;
      bVar15 = false;
    }
    else {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = (byte *)0x0;
      uStack_60 = 0;
      iVar4 = __isoc99_sscanf(date,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &local_68);
      if (iVar4 == 0) {
        local_70 = (byte *)0x0;
      }
      else {
        local_70 = (byte *)strlen((char *)&local_68);
      }
      if ((int)lVar8 == -1) {
        ppcVar12 = Curl_wkday;
        if ((byte *)0x3 < local_70) {
          ppcVar12 = weekday;
        }
        lVar8 = 0;
        local_88 = iVar5;
        do {
          iVar5 = Curl_strcasecompare((char *)&local_68,ppcVar12[lVar8]);
          if (iVar5 != 0) goto LAB_001354fa;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 7);
        lVar8 = 0xffffffff;
LAB_001354fa:
        bVar15 = (int)lVar8 != -1;
      }
      else {
        bVar15 = false;
        local_88 = iVar5;
      }
      if ((!bVar15) && (iVar10 == -1)) {
        iVar10 = 0;
        ppcVar12 = Curl_month;
        do {
          iVar5 = Curl_strcasecompare((char *)&local_68,*ppcVar12);
          if (iVar5 != 0) goto LAB_00135541;
          ppcVar12 = ppcVar12 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0xc);
        iVar10 = -1;
LAB_00135541:
        bVar15 = iVar10 != -1;
      }
      if ((!bVar15) && (iVar11 == -1)) {
        lVar13 = 0;
        do {
          iVar5 = Curl_strcasecompare((char *)&local_68,tz[0].name + lVar13);
          if (iVar5 != 0) {
            iVar11 = *(int *)(tz[0].name + lVar13 + 8) * 0x3c;
            goto LAB_001355f0;
          }
          lVar13 = lVar13 + 0xc;
        } while ((int)lVar13 != 0x33c);
        iVar11 = -1;
LAB_001355f0:
        bVar15 = iVar11 != -1;
      }
      iVar5 = local_88;
      if (bVar15) {
        date = (char *)((byte *)date + (long)local_70);
LAB_0013587b:
        bVar15 = true;
        iVar5 = iVar5 + 1;
      }
      else {
        bVar15 = false;
      }
    }
    if (!bVar15) {
      return -1;
    }
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}